

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::analysis::TypeManager::GetTypeInstruction(TypeManager *this,Type *type)

{
  undefined8 *puVar1;
  Type *pTVar2;
  uint32_t id_00;
  int iVar3;
  PodType PVar4;
  array<signed_char,_4UL> aVar5;
  const_iterator cVar6;
  undefined4 extraout_var;
  IRContext *pIVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  Op op;
  undefined8 *puVar8;
  long lVar9;
  pointer *__ptr_1;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *pdVar10;
  IRContext *pIVar11;
  pointer *__ptr;
  pointer *__ptr_3;
  uint32_t id;
  size_type __dnew;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> ops;
  string message;
  uint32_t local_33c;
  undefined1 local_338 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_318;
  undefined1 local_308 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_2e8;
  undefined1 local_2d8 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_2b8;
  undefined1 local_2b0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_290;
  undefined1 local_288 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_268;
  undefined1 local_260 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_240;
  undefined1 local_238 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_218;
  int local_210;
  Op local_20c;
  undefined1 local_208 [8];
  undefined1 auStack_200 [16];
  undefined1 local_1f0 [16];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_1e0;
  spv_operand_type_t local_1d8;
  undefined1 local_1d0 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_1b0;
  spv_operand_type_t local_1a8;
  SmallVector<unsigned_int,_2UL> local_1a0;
  float local_178;
  undefined1 local_170 [32];
  __node_base local_150;
  spv_operand_type_t local_148;
  undefined1 local_140 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_120;
  undefined4 local_118;
  SmallVector<unsigned_int,_2UL> local_110;
  undefined4 local_e8;
  SmallVector<unsigned_int,_2UL> local_e0;
  undefined4 local_b8;
  undefined1 local_b0 [24];
  _Base_ptr local_98;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_90;
  Type *local_80;
  undefined8 local_78;
  initializer_list<spvtools::opt::Operand> local_70;
  undefined1 local_60 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_40;
  __node_base local_38;
  
  local_208 = (undefined1  [8])type;
  cVar6 = std::
          _Hashtable<const_spvtools::opt::analysis::Type_*,_std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>,_std::__detail::_Select1st,_spvtools::opt::analysis::CompareTypePointers,_spvtools::opt::analysis::HashTypePointer,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->type_to_id_)._M_h,(key_type *)local_208);
  if (cVar6.
      super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_33c = 0;
  }
  else {
    local_33c = *(uint32_t *)
                 ((long)cVar6.
                        super__Node_iterator_base<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>,_true>
                        ._M_cur + 0x10);
  }
  if (local_33c != 0) {
    return local_33c;
  }
  pIVar7 = this->context_;
  id_00 = Module::TakeNextIdBound
                    ((pIVar7->module_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                     .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  local_80 = type;
  if ((id_00 == 0) && ((pIVar7->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_338._0_8_ = (spv_operand_table)0x25;
    local_208 = (undefined1  [8])(auStack_200 + 8);
    local_208 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_208,(ulong)local_338);
    auStack_200._8_8_ = local_338._0_8_;
    *(undefined8 *)local_208 = 0x667265766f204449;
    (((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       *)&((spv_context)local_208)->opcode_table)->
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x797254202e776f6c;
    ((spv_context)local_208)->operand_table = (spv_operand_table)0x676e696e6e757220;
    ((spv_context)local_208)->ext_inst_table = (spv_ext_inst_table)0x746361706d6f6320;
    *(undefined8 *)((long)&((spv_context)local_208)->ext_inst_table + 5) = 0x2e7364692d746361;
    auStack_200._0_8_ = local_338._0_8_;
    *(char *)((long)&((spv_context)local_208)->target_env + local_338._0_8_) = '\0';
    local_338._0_8_ = (IRContext *)0x0;
    local_338._8_8_ = 0;
    local_338._16_4_ = (array<signed_char,_4UL>)0x0;
    local_338._20_4_ = (array<signed_char,_4UL>)0x0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&pIVar7->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)local_338,(char *)local_208);
    if (local_208 != (undefined1  [8])(auStack_200 + 8)) {
      operator_delete((void *)local_208,(ulong)((long)(uint32_t *)auStack_200._8_8_ + 1));
    }
  }
  pTVar2 = local_80;
  if (id_00 == 0) {
    return 0;
  }
  local_33c = id_00;
  RegisterType(this,id_00,local_80);
  switch(pTVar2->kind_) {
  case kVoid:
    local_308._0_8_ = this->context_;
    local_2b0._0_4_ = 0x13;
    break;
  case kBool:
    local_308._0_8_ = this->context_;
    local_2b0._0_4_ = 0x14;
    break;
  case kInteger:
    local_288._0_8_ = this->context_;
    local_260._0_4_ = 0x15;
    local_238._0_8_ = (ulong)(uint)local_238._4_4_ << 0x20;
    iVar3 = (*pTVar2->_vptr_Type[10])(pTVar2);
    local_338._24_8_ = local_338 + 0x10;
    local_338._0_8_ = &PTR__SmallVector_003e9b28;
    local_318._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_338._16_4_ =
         *&((array<signed_char,_4UL> *)(CONCAT44(extraout_var_08,iVar3) + 0x24))->_M_elems;
    local_338._8_8_ = 1;
    local_208._0_4_ = 6;
    auStack_200._0_8_ = &PTR__SmallVector_003e9b28;
    auStack_200._8_8_ = (spv_operand_table)0x0;
    local_1f0._8_8_ = local_1f0;
    local_1e0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_200,
               (SmallVector<unsigned_int,_2UL> *)local_338);
    iVar3 = (*pTVar2->_vptr_Type[10])(pTVar2);
    local_308._24_8_ = local_308 + 0x10;
    local_308._0_8_ = &PTR__SmallVector_003e9b28;
    local_2e8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_308._17_3_ = 0;
    local_308[0x10] = *(byte *)(CONCAT44(extraout_var_09,iVar3) + 0x28);
    local_308._8_8_ = (pointer)0x1;
    local_1d8 = SPV_OPERAND_TYPE_LITERAL_INTEGER;
    local_1d0._0_8_ = &PTR__SmallVector_003e9b28;
    local_1d0._8_8_ = 0;
    local_1d0._24_8_ = local_1d0 + 0x10;
    pdVar10 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
              &local_1b0;
    local_1b0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_1d0,
               (SmallVector<unsigned_int,_2UL> *)local_308);
    local_2b0._0_8_ = local_208;
    local_2b0._8_8_ = 2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)local_2d8,(IRContext **)local_288,(Op *)local_260,(int *)local_238,
               &local_33c,(initializer_list<spvtools::opt::Operand> *)local_2b0);
    pIVar7 = (IRContext *)local_2d8._0_8_;
    local_2d8._0_8_ = (IRContext *)0x0;
    lVar9 = -0x60;
    do {
      *(undefined ***)(pdVar10 + -0x20) = &PTR__SmallVector_003e9b28;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar10,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10);
      }
      *(undefined8 *)pdVar10 = 0;
      pdVar10 = pdVar10 + -0x30;
      lVar9 = lVar9 + 0x30;
    } while (lVar9 != 0);
    goto LAB_001a8443;
  case kFloat:
    local_2d8._0_8_ = this->context_;
    local_288._0_4_ = 0x16;
    local_260._0_8_ = (ulong)(uint)local_260._4_4_ << 0x20;
    iVar3 = (*pTVar2->_vptr_Type[0xc])();
    local_338._16_4_ =
         *&((array<signed_char,_4UL> *)(CONCAT44(extraout_var_10,iVar3) + 0x24))->_M_elems;
    local_208._0_4_ = 6;
    goto LAB_001a8dbc;
  case kVector:
    iVar3 = (*pTVar2->_vptr_Type[0xe])(pTVar2);
    PVar4.data._M_elems =
         (array<signed_char,_4UL>)
         GetTypeInstruction(this,*(Type **)(CONCAT44(extraout_var_01,iVar3) + 0x28));
    if (PVar4.data._M_elems == (_Type)0x0) {
      return 0;
    }
    local_288._0_8_ = this->context_;
    local_260._0_4_ = 0x17;
    local_238._0_8_ = (ulong)(uint)local_238._4_4_ << 0x20;
    local_338._24_8_ = local_338 + 0x10;
    local_338._0_8_ = &PTR__SmallVector_003e9b28;
    local_318._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_338._16_4_ = PVar4.data._M_elems;
    local_338._8_8_ = 1;
    local_208._0_4_ = 1;
    auStack_200._0_8_ = &PTR__SmallVector_003e9b28;
    auStack_200._8_8_ = (spv_operand_table)0x0;
    local_1f0._8_8_ = local_1f0;
    local_1e0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_200,
               (SmallVector<unsigned_int,_2UL> *)local_338);
    iVar3 = (*pTVar2->_vptr_Type[0xe])(pTVar2);
    local_308._24_8_ = local_308 + 0x10;
    local_308._0_8_ = &PTR__SmallVector_003e9b28;
    local_2e8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_308._16_4_ =
         *&((array<signed_char,_4UL> *)(CONCAT44(extraout_var_02,iVar3) + 0x30))->_M_elems;
    local_308._8_8_ = (pointer)0x1;
    local_1d8 = SPV_OPERAND_TYPE_LITERAL_INTEGER;
    local_1d0._0_8_ = &PTR__SmallVector_003e9b28;
    local_1d0._8_8_ = 0;
    local_1d0._24_8_ = local_1d0 + 0x10;
    pdVar10 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
              &local_1b0;
    local_1b0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_1d0,
               (SmallVector<unsigned_int,_2UL> *)local_308);
    local_2b0._0_8_ = local_208;
    local_2b0._8_8_ = 2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)local_2d8,(IRContext **)local_288,(Op *)local_260,(int *)local_238,
               &local_33c,(initializer_list<spvtools::opt::Operand> *)local_2b0);
    pIVar7 = (IRContext *)local_2d8._0_8_;
    local_2d8._0_8_ = (IRContext *)0x0;
    lVar9 = -0x60;
    do {
      *(undefined ***)(pdVar10 + -0x20) = &PTR__SmallVector_003e9b28;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar10,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10);
      }
      *(undefined8 *)pdVar10 = 0;
      pdVar10 = pdVar10 + -0x30;
      lVar9 = lVar9 + 0x30;
    } while (lVar9 != 0);
    goto LAB_001a8c2f;
  case kMatrix:
    iVar3 = (*pTVar2->_vptr_Type[0x10])(pTVar2);
    PVar4.data._M_elems =
         (array<signed_char,_4UL>)
         GetTypeInstruction(this,*(Type **)(CONCAT44(extraout_var_13,iVar3) + 0x28));
    if (PVar4.data._M_elems == (_Type)0x0) {
      return 0;
    }
    local_288._0_8_ = this->context_;
    local_260._0_4_ = 0x18;
    local_238._0_8_ = (ulong)(uint)local_238._4_4_ << 0x20;
    local_338._24_8_ = local_338 + 0x10;
    local_338._0_8_ = &PTR__SmallVector_003e9b28;
    local_318._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_338._16_4_ = PVar4.data._M_elems;
    local_338._8_8_ = 1;
    local_208._0_4_ = 1;
    auStack_200._0_8_ = &PTR__SmallVector_003e9b28;
    auStack_200._8_8_ = (spv_operand_table)0x0;
    local_1f0._8_8_ = local_1f0;
    local_1e0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_200,
               (SmallVector<unsigned_int,_2UL> *)local_338);
    iVar3 = (*pTVar2->_vptr_Type[0x10])(pTVar2);
    local_308._24_8_ = local_308 + 0x10;
    local_308._0_8_ = &PTR__SmallVector_003e9b28;
    local_2e8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_308._16_4_ =
         *&((array<signed_char,_4UL> *)(CONCAT44(extraout_var_14,iVar3) + 0x30))->_M_elems;
    local_308._8_8_ = (pointer)0x1;
    local_1d8 = SPV_OPERAND_TYPE_LITERAL_INTEGER;
    local_1d0._0_8_ = &PTR__SmallVector_003e9b28;
    local_1d0._8_8_ = 0;
    local_1d0._24_8_ = local_1d0 + 0x10;
    pdVar10 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
              &local_1b0;
    local_1b0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_1d0,
               (SmallVector<unsigned_int,_2UL> *)local_308);
    local_2b0._0_8_ = local_208;
    local_2b0._8_8_ = 2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)local_2d8,(IRContext **)local_288,(Op *)local_260,(int *)local_238,
               &local_33c,(initializer_list<spvtools::opt::Operand> *)local_2b0);
    pIVar7 = (IRContext *)local_2d8._0_8_;
    local_2d8._0_8_ = (IRContext *)0x0;
    lVar9 = -0x60;
    do {
      *(undefined ***)(pdVar10 + -0x20) = &PTR__SmallVector_003e9b28;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar10,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10);
      }
      *(undefined8 *)pdVar10 = 0;
      pdVar10 = pdVar10 + -0x30;
      lVar9 = lVar9 + 0x30;
    } while (lVar9 != 0);
    goto LAB_001a8c2f;
  case kImage:
    iVar3 = (*pTVar2->_vptr_Type[0x12])(pTVar2);
    lVar9 = CONCAT44(extraout_var_16,iVar3);
    PVar4.data._M_elems = (array<signed_char,_4UL>)GetTypeInstruction(this,*(Type **)(lVar9 + 0x28))
    ;
    if (PVar4.data._M_elems == (_Type)0x0) {
      return 0;
    }
    local_38._M_nxt = (_Hash_node_base *)this->context_;
    local_20c = OpTypeImage;
    local_210 = 0;
    local_338._24_8_ = local_338 + 0x10;
    local_338._0_8_ = &PTR__SmallVector_003e9b28;
    local_318._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_338._16_4_ = PVar4.data._M_elems;
    local_338._8_8_ = 1;
    local_208._0_4_ = 1;
    auStack_200._0_8_ = &PTR__SmallVector_003e9b28;
    auStack_200._8_8_ = (spv_operand_table)0x0;
    local_1f0._8_8_ = local_1f0;
    local_1e0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_200,
               (SmallVector<unsigned_int,_2UL> *)local_338);
    local_308._24_8_ = local_308 + 0x10;
    local_308._0_8_ = &PTR__SmallVector_003e9b28;
    local_2e8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_308._16_4_ = *&((array<signed_char,_4UL> *)(lVar9 + 0x30))->_M_elems;
    local_308._8_8_ = (pointer)0x1;
    local_1d8 = SPV_OPERAND_TYPE_DIMENSIONALITY;
    local_1d0._0_8_ = &PTR__SmallVector_003e9b28;
    local_1d0._8_8_ = 0;
    local_1d0._24_8_ = local_1d0 + 0x10;
    local_1b0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_1d0,
               (SmallVector<unsigned_int,_2UL> *)local_308);
    local_2b0._16_4_ = *(_Type *)(lVar9 + 0x34);
    local_2b0._24_8_ = local_2b0 + 0x10;
    local_2b0._0_8_ = &PTR__SmallVector_003e9b28;
    local_290._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2b0._8_8_ = 1;
    local_1a8 = SPV_OPERAND_TYPE_LITERAL_INTEGER;
    local_1a0._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
    local_1a0.size_ = 0;
    local_1a0.small_data_ = (uint *)local_1a0.buffer;
    local_1a0.large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&local_1a0,(SmallVector<unsigned_int,_2UL> *)local_2b0);
    local_2d8._24_8_ = local_2d8 + 0x10;
    local_2d8._0_8_ = &PTR__SmallVector_003e9b28;
    local_2b8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2d8[0x11] = '\0';
    local_2d8[0x12] = '\0';
    local_2d8[0x13] = '\0';
    local_2d8[0x10] = *(byte *)(lVar9 + 0x38);
    local_2d8._8_8_ = 1;
    local_178 = 8.40779e-45;
    local_170._0_8_ = &PTR__SmallVector_003e9b28;
    local_170._8_8_ = (__node_base_ptr)0x0;
    local_170._24_8_ = local_170 + 0x10;
    local_150._M_nxt = (_Hash_node_base *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_170,
               (SmallVector<unsigned_int,_2UL> *)local_2d8);
    local_288._24_8_ = local_288 + 0x10;
    local_288._0_8_ = &PTR__SmallVector_003e9b28;
    local_268._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_288[0x11] = '\0';
    local_288[0x12] = '\0';
    local_288[0x13] = '\0';
    local_288[0x10] = *(byte *)(lVar9 + 0x39);
    local_288._8_8_ = 1;
    local_148 = SPV_OPERAND_TYPE_LITERAL_INTEGER;
    local_140._0_8_ = &PTR__SmallVector_003e9b28;
    local_140._8_8_ = 0;
    local_140._24_8_ = local_140 + 0x10;
    local_120._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_140,
               (SmallVector<unsigned_int,_2UL> *)local_288);
    local_260._16_4_ = *(_Type *)(lVar9 + 0x3c);
    local_260._24_8_ = local_260 + 0x10;
    local_260._0_8_ = &PTR__SmallVector_003e9b28;
    local_240._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_260._8_8_ = 1;
    local_118 = 6;
    local_110._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
    local_110.size_ = 0;
    local_110.small_data_ = (uint *)local_110.buffer;
    local_110.large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&local_110,(SmallVector<unsigned_int,_2UL> *)local_260);
    local_238._16_4_ = *(_Type *)(lVar9 + 0x40);
    local_238._24_8_ = local_238 + 0x10;
    local_238._0_8_ = &PTR__SmallVector_003e9b28;
    local_218._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_238._8_8_ = 1;
    local_e8 = 0x15;
    local_e0._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
    local_e0.size_ = 0;
    local_e0.small_data_ = (uint *)local_e0.buffer;
    local_e0.large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&local_e0,(SmallVector<unsigned_int,_2UL> *)local_238);
    local_60._16_4_ = *(_Type *)(lVar9 + 0x44);
    local_60._24_8_ = local_60 + 0x10;
    local_60._0_8_ = &PTR__SmallVector_003e9b28;
    local_40._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_60._8_8_ = (_Base_ptr)0x1;
    local_b8 = 0x1a;
    local_b0._0_8_ = &PTR__SmallVector_003e9b28;
    local_b0._8_8_ = 0;
    local_98 = (_Base_ptr)(local_b0 + 0x10);
    pdVar10 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_90
    ;
    local_90._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_b0,(SmallVector<unsigned_int,_2UL> *)local_60
              );
    local_70._M_array = (iterator)local_208;
    local_70._M_len = 8;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_78,(IRContext **)&local_38,&local_20c,&local_210,&local_33c,
               &local_70);
    pIVar7 = local_78;
    local_78 = (IRContext *)0x0;
    lVar9 = -0x180;
    do {
      *(undefined ***)(pdVar10 + -0x20) = &PTR__SmallVector_003e9b28;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar10,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10);
      }
      *(undefined8 *)pdVar10 = 0;
      pdVar10 = pdVar10 + -0x30;
      lVar9 = lVar9 + 0x30;
    } while (lVar9 != 0);
    local_60._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_40._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl !=
        (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_40,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_40._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    local_238._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_218._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl !=
        (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_218,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_218._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    local_260._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_240._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_240,local_240._M_head_impl);
    }
    local_288._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_268._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_268,local_268._M_head_impl);
    }
    goto LAB_001a8bee;
  case kSampler:
    local_308._0_8_ = this->context_;
    local_2b0._0_4_ = 0x1a;
    break;
  case kSampledImage:
    iVar3 = (*pTVar2->_vptr_Type[0x16])(pTVar2);
    aVar5._M_elems =
         (_Type)GetTypeInstruction(this,*(Type **)(CONCAT44(extraout_var_18,iVar3) + 0x28));
    if (aVar5._M_elems == (_Type)0x0) {
      return 0;
    }
    local_2d8._0_8_ = this->context_;
    local_288._0_4_ = 0x1b;
    goto LAB_001a8ce7;
  case kArray:
    iVar3 = (*pTVar2->_vptr_Type[0x18])(pTVar2);
    PVar4.data._M_elems =
         (array<signed_char,_4UL>)
         GetTypeInstruction(this,*(Type **)(CONCAT44(extraout_var_04,iVar3) + 0x28));
    if (PVar4.data._M_elems == (_Type)0x0) {
      return 0;
    }
    local_288._0_8_ = this->context_;
    local_260._0_4_ = 0x1c;
    local_238._0_8_ = (ulong)(uint)local_238._4_4_ << 0x20;
    local_338._24_8_ = local_338 + 0x10;
    local_338._0_8_ = &PTR__SmallVector_003e9b28;
    local_318._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_338._16_4_ = PVar4.data._M_elems;
    local_338._8_8_ = 1;
    local_208._0_4_ = 1;
    auStack_200._0_8_ = &PTR__SmallVector_003e9b28;
    auStack_200._8_8_ = (spv_operand_table)0x0;
    local_1f0._8_8_ = local_1f0;
    local_1e0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_200,
               (SmallVector<unsigned_int,_2UL> *)local_338);
    iVar3 = (*pTVar2->_vptr_Type[0x18])(pTVar2);
    local_308._24_8_ = local_308 + 0x10;
    local_308._0_8_ = &PTR__SmallVector_003e9b28;
    local_2e8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_308._16_4_ =
         *&((array<signed_char,_4UL> *)(CONCAT44(extraout_var_05,iVar3) + 0x30))->_M_elems;
    local_308._8_8_ = (pointer)0x1;
    local_1d8 = SPV_OPERAND_TYPE_ID;
    local_1d0._0_8_ = &PTR__SmallVector_003e9b28;
    local_1d0._8_8_ = 0;
    local_1d0._24_8_ = local_1d0 + 0x10;
    pdVar10 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
              &local_1b0;
    local_1b0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_1d0,
               (SmallVector<unsigned_int,_2UL> *)local_308);
    local_2b0._0_8_ = local_208;
    local_2b0._8_8_ = 2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)local_2d8,(IRContext **)local_288,(Op *)local_260,(int *)local_238,
               &local_33c,(initializer_list<spvtools::opt::Operand> *)local_2b0);
    pIVar7 = (IRContext *)local_2d8._0_8_;
    local_2d8._0_8_ = (IRContext *)0x0;
    lVar9 = -0x60;
    do {
      *(undefined ***)(pdVar10 + -0x20) = &PTR__SmallVector_003e9b28;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar10,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10);
      }
      *(undefined8 *)pdVar10 = 0;
      pdVar10 = pdVar10 + -0x30;
      lVar9 = lVar9 + 0x30;
    } while (lVar9 != 0);
    goto LAB_001a8443;
  case kRuntimeArray:
    iVar3 = (*pTVar2->_vptr_Type[0x1a])(pTVar2);
    aVar5._M_elems =
         (_Type)GetTypeInstruction(this,*(Type **)(CONCAT44(extraout_var_17,iVar3) + 0x28));
    if (aVar5._M_elems == (_Type)0x0) {
      return 0;
    }
    local_2d8._0_8_ = this->context_;
    local_288._0_4_ = 0x1d;
LAB_001a8ce7:
    local_260._0_8_ = (ulong)(uint)local_260._4_4_ << 0x20;
    local_338._16_4_ = aVar5._M_elems;
    local_208._0_4_ = 1;
    goto LAB_001a8dbc;
  case kStruct:
    local_308._0_8_ = (IRContext *)0x0;
    local_308._8_8_ = (pointer)0x0;
    local_308._16_4_ = (array<signed_char,_4UL>)0x0;
    local_308._20_4_ = (array<signed_char,_4UL>)0x0;
    iVar3 = (*pTVar2->_vptr_Type[0x1c])(pTVar2);
    puVar8 = *(undefined8 **)(CONCAT44(extraout_var_00,iVar3) + 0x28);
    puVar1 = *(undefined8 **)(CONCAT44(extraout_var_00,iVar3) + 0x30);
    if (puVar8 != puVar1) {
      do {
        PVar4.data._M_elems = (array<signed_char,_4UL>)GetTypeInstruction(this,(Type *)*puVar8);
        if (PVar4.data._M_elems == (_Type)0x0) {
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                     local_308);
          return 0;
        }
        local_338._0_8_ = &PTR__SmallVector_003e9b28;
        local_338._24_8_ = local_338 + 0x10;
        local_318._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_338._16_4_ = PVar4.data._M_elems;
        local_338._8_8_ = 1;
        local_208._0_4_ = 1;
        auStack_200._0_8_ = &PTR__SmallVector_003e9b28;
        auStack_200._8_8_ = (spv_operand_table)0x0;
        local_1f0._8_8_ = local_1f0;
        local_1e0._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )0x0;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)auStack_200,
                   (SmallVector<unsigned_int,_2UL> *)local_338);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   local_308,(Operand *)local_208);
        auStack_200._0_8_ = &PTR__SmallVector_003e9b28;
        if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )local_1e0._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_1e0,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     local_1e0._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl);
        }
        local_1e0._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )0x0;
        local_338._0_8_ = &PTR__SmallVector_003e9b28;
        if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )local_318._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
        {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_318,local_318._M_head_impl);
        }
        puVar8 = puVar8 + 1;
      } while (puVar8 != puVar1);
    }
    pIVar11 = this->context_;
    pIVar7 = (IRContext *)operator_new(0x70);
    op = OpTypeStruct;
    goto LAB_001a76c8;
  case kOpaque:
    iVar3 = (*pTVar2->_vptr_Type[0x1e])(pTVar2);
    utils::MakeVector((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_308,
                      (string *)(CONCAT44(extraout_var_03,iVar3) + 0x28));
    local_288._0_8_ = this->context_;
    local_260._0_4_ = 0x1f;
    local_238._0_8_ = (ulong)(uint)local_238._4_4_ << 0x20;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)local_338,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_308);
    local_208._0_4_ = 0xb;
    auStack_200._0_8_ = &PTR__SmallVector_003e9b28;
    auStack_200._8_8_ = (spv_operand_table)0x0;
    local_1f0._8_8_ = local_1f0;
    local_1e0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_200,
               (SmallVector<unsigned_int,_2UL> *)local_338);
    local_2b0._0_8_ = local_208;
    local_2b0._8_8_ = 1;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)local_2d8,(IRContext **)local_288,(Op *)local_260,(int *)local_238,
               &local_33c,(initializer_list<spvtools::opt::Operand> *)local_2b0);
    pIVar7 = (IRContext *)local_2d8._0_8_;
    local_2d8._0_8_ = (IRContext *)0x0;
    auStack_200._0_8_ = &PTR__SmallVector_003e9b28;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_1e0._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_1e0,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_1e0._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    local_1e0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_338._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_318._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_318,local_318._M_head_impl);
    }
    if ((IRContext *)local_308._0_8_ != (IRContext *)0x0) {
      operator_delete((void *)local_308._0_8_,local_308._16_8_ - local_308._0_8_);
    }
    goto LAB_001a8ec2;
  case kPointer:
    iVar3 = (*pTVar2->_vptr_Type[0x20])(pTVar2);
    local_308._16_4_ = GetTypeInstruction(this,*(Type **)(CONCAT44(extraout_var_15,iVar3) + 0x28));
    if ((_Type)local_308._16_4_ == (_Type)0x0) {
      return 0;
    }
    local_288._0_8_ = this->context_;
    local_260._0_4_ = 0x20;
    local_238._0_8_ = (ulong)(uint)local_238._4_4_ << 0x20;
    local_338._24_8_ = local_338 + 0x10;
    local_338._0_8_ = &PTR__SmallVector_003e9b28;
    local_318._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_338._16_4_ =
         *&((array<signed_char,_4UL> *)(CONCAT44(extraout_var_15,iVar3) + 0x30))->_M_elems;
    local_338._8_8_ = 1;
    local_208._0_4_ = 0x11;
    auStack_200._0_8_ = &PTR__SmallVector_003e9b28;
    auStack_200._8_8_ = (spv_operand_table)0x0;
    local_1f0._8_8_ = local_1f0;
    local_1e0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_200,
               (SmallVector<unsigned_int,_2UL> *)local_338);
    local_308._24_8_ = local_308 + 0x10;
    local_308._0_8_ = &PTR__SmallVector_003e9b28;
    local_2e8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_308._8_8_ = (pointer)0x1;
    local_1d8 = SPV_OPERAND_TYPE_ID;
    local_1d0._0_8_ = &PTR__SmallVector_003e9b28;
    local_1d0._8_8_ = 0;
    local_1d0._24_8_ = local_1d0 + 0x10;
    pdVar10 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
              &local_1b0;
    local_1b0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_1d0,
               (SmallVector<unsigned_int,_2UL> *)local_308);
    local_2b0._0_8_ = local_208;
    local_2b0._8_8_ = 2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)local_2d8,(IRContext **)local_288,(Op *)local_260,(int *)local_238,
               &local_33c,(initializer_list<spvtools::opt::Operand> *)local_2b0);
    pIVar7 = (IRContext *)local_2d8._0_8_;
    local_2d8._0_8_ = (IRContext *)0x0;
    lVar9 = -0x60;
    do {
      *(undefined ***)(pdVar10 + -0x20) = &PTR__SmallVector_003e9b28;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar10,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10);
      }
      *(undefined8 *)pdVar10 = 0;
      pdVar10 = pdVar10 + -0x30;
      lVar9 = lVar9 + 0x30;
    } while (lVar9 != 0);
    goto LAB_001a8794;
  case kFunction:
    local_308._0_8_ = (IRContext *)0x0;
    local_308._8_8_ = (pointer)0x0;
    local_308._16_4_ = (array<signed_char,_4UL>)0x0;
    local_308._20_4_ = (array<signed_char,_4UL>)0x0;
    iVar3 = (*pTVar2->_vptr_Type[0x22])(pTVar2);
    lVar9 = CONCAT44(extraout_var,iVar3);
    PVar4.data._M_elems = (array<signed_char,_4UL>)GetTypeInstruction(this,*(Type **)(lVar9 + 0x28))
    ;
    if (PVar4.data._M_elems == (_Type)0x0) {
LAB_001a8f44:
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 local_308);
      return 0;
    }
    local_338._24_8_ = local_338 + 0x10;
    local_338._0_8_ = &PTR__SmallVector_003e9b28;
    local_318._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_338._16_4_ = PVar4.data._M_elems;
    local_338._8_8_ = 1;
    local_208._0_4_ = 1;
    auStack_200._0_8_ = &PTR__SmallVector_003e9b28;
    auStack_200._8_8_ = (spv_operand_table)0x0;
    local_1f0._8_8_ = local_1f0;
    local_1e0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_200,
               (SmallVector<unsigned_int,_2UL> *)local_338);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_308,
               (Operand *)local_208);
    auStack_200._0_8_ = &PTR__SmallVector_003e9b28;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_1e0._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_1e0,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_1e0._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    local_1e0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_338._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_318._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_318,local_318._M_head_impl);
    }
    puVar1 = *(undefined8 **)(lVar9 + 0x38);
    for (puVar8 = *(undefined8 **)(lVar9 + 0x30); puVar8 != puVar1; puVar8 = puVar8 + 1) {
      PVar4.data._M_elems = (array<signed_char,_4UL>)GetTypeInstruction(this,(Type *)*puVar8);
      if (PVar4.data._M_elems == (_Type)0x0) goto LAB_001a8f44;
      local_338._0_8_ = &PTR__SmallVector_003e9b28;
      local_338._24_8_ = local_338 + 0x10;
      local_318._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_338._16_4_ = PVar4.data._M_elems;
      local_338._8_8_ = 1;
      local_208._0_4_ = 1;
      auStack_200._0_8_ = &PTR__SmallVector_003e9b28;
      auStack_200._8_8_ = (spv_operand_table)0x0;
      local_1f0._8_8_ = local_1f0;
      local_1e0._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)auStack_200,
                 (SmallVector<unsigned_int,_2UL> *)local_338);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 local_308,(Operand *)local_208);
      auStack_200._0_8_ = &PTR__SmallVector_003e9b28;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )local_1e0._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_1e0,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   local_1e0._M_t.
                   super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   .
                   super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   ._M_head_impl);
      }
      local_1e0._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      local_338._0_8_ = &PTR__SmallVector_003e9b28;
      if (local_318._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_318,local_318._M_head_impl);
      }
    }
    pIVar11 = this->context_;
    pIVar7 = (IRContext *)operator_new(0x70);
    op = OpTypeFunction;
LAB_001a76c8:
    Instruction::Instruction
              ((Instruction *)pIVar7,pIVar11,op,0,local_33c,
               (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_308)
    ;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_308)
    ;
    goto LAB_001a8ec2;
  case kEvent:
    local_308._0_8_ = this->context_;
    local_2b0._0_4_ = 0x22;
    break;
  case kDeviceEvent:
    local_308._0_8_ = this->context_;
    local_2b0._0_4_ = 0x23;
    break;
  case kReserveId:
    local_308._0_8_ = this->context_;
    local_2b0._0_4_ = 0x24;
    break;
  case kQueue:
    local_308._0_8_ = this->context_;
    local_2b0._0_4_ = 0x25;
    break;
  case kPipe:
    local_2d8._0_8_ = this->context_;
    local_288._0_4_ = 0x26;
    local_260._0_8_ = (ulong)(uint)local_260._4_4_ << 0x20;
    iVar3 = (*pTVar2->_vptr_Type[0x2c])();
    local_338._16_4_ =
         *&((array<signed_char,_4UL> *)(CONCAT44(extraout_var_19,iVar3) + 0x24))->_M_elems;
    local_208._0_4_ = 0x1a;
LAB_001a8dbc:
    local_338._24_8_ = local_338 + 0x10;
    local_318._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_338._8_8_ = 1;
    local_338._0_8_ = &PTR__SmallVector_003e9b28;
    auStack_200._0_8_ = &PTR__SmallVector_003e9b28;
    auStack_200._8_8_ = (spv_operand_table)0x0;
    local_1f0._8_8_ = local_1f0;
    local_1e0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_200,
               (SmallVector<unsigned_int,_2UL> *)local_338);
    local_308._0_8_ = local_208;
    local_308._8_8_ = (pointer)0x1;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)local_2b0,(IRContext **)local_2d8,(Op *)local_288,(int *)local_260,
               &local_33c,(initializer_list<spvtools::opt::Operand> *)local_308);
    pIVar7 = (IRContext *)local_2b0._0_8_;
    local_2b0._0_8_ = (IRContext *)0x0;
    auStack_200._0_8_ = &PTR__SmallVector_003e9b28;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_1e0._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_1e0,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_1e0._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    local_1e0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    goto LAB_001a8e47;
  case kForwardPointer:
    local_288._0_8_ = this->context_;
    local_260._0_4_ = 0x27;
    local_238._0_8_ = (ulong)(uint)local_238._4_4_ << 0x20;
    local_60._0_8_ = local_60._0_8_ & 0xffffffff00000000;
    iVar3 = (*pTVar2->_vptr_Type[0x2e])(pTVar2);
    local_338._24_8_ = local_338 + 0x10;
    local_338._0_8_ = &PTR__SmallVector_003e9b28;
    local_318._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_338._16_4_ =
         *&((array<signed_char,_4UL> *)(CONCAT44(extraout_var_11,iVar3) + 0x24))->_M_elems;
    local_338._8_8_ = 1;
    local_208._0_4_ = 1;
    auStack_200._0_8_ = &PTR__SmallVector_003e9b28;
    auStack_200._8_8_ = (spv_operand_table)0x0;
    local_1f0._8_8_ = local_1f0;
    local_1e0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_200,
               (SmallVector<unsigned_int,_2UL> *)local_338);
    iVar3 = (*pTVar2->_vptr_Type[0x2e])(pTVar2);
    local_308._24_8_ = local_308 + 0x10;
    local_308._0_8_ = &PTR__SmallVector_003e9b28;
    local_2e8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_308._16_4_ =
         *&((array<signed_char,_4UL> *)(CONCAT44(extraout_var_12,iVar3) + 0x28))->_M_elems;
    local_308._8_8_ = (pointer)0x1;
    local_1d8 = SPV_OPERAND_TYPE_STORAGE_CLASS;
    local_1d0._0_8_ = &PTR__SmallVector_003e9b28;
    local_1d0._8_8_ = 0;
    local_1d0._24_8_ = local_1d0 + 0x10;
    pdVar10 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
              &local_1b0;
    local_1b0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_1d0,
               (SmallVector<unsigned_int,_2UL> *)local_308);
    local_2b0._0_8_ = local_208;
    local_2b0._8_8_ = 2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)local_2d8,(IRContext **)local_288,(Op *)local_260,(int *)local_238,
               (int *)local_60,(initializer_list<spvtools::opt::Operand> *)local_2b0);
    pIVar7 = (IRContext *)local_2d8._0_8_;
    local_2d8._0_8_ = (IRContext *)0x0;
    lVar9 = -0x60;
    do {
      *(undefined ***)(pdVar10 + -0x20) = &PTR__SmallVector_003e9b28;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar10,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10);
      }
      *(undefined8 *)pdVar10 = 0;
      pdVar10 = pdVar10 + -0x30;
      lVar9 = lVar9 + 0x30;
    } while (lVar9 != 0);
LAB_001a8443:
    local_308._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_2e8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_2e8,local_2e8._M_head_impl);
    }
LAB_001a8e47:
    local_338._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_318._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_318,local_318._M_head_impl);
    }
    goto LAB_001a8ec2;
  case kPipeStorage:
    local_308._0_8_ = this->context_;
    local_2b0._0_4_ = 0x142;
    break;
  case kNamedBarrier:
    local_308._0_8_ = this->context_;
    local_2b0._0_4_ = 0x147;
    break;
  case kAccelerationStructureNV:
    local_308._0_8_ = this->context_;
    local_2b0._0_4_ = 0x14dd;
    break;
  case kCooperativeMatrixNV:
    iVar3 = (*pTVar2->_vptr_Type[0x36])(pTVar2);
    lVar9 = CONCAT44(extraout_var_07,iVar3);
    PVar4.data._M_elems = (array<signed_char,_4UL>)GetTypeInstruction(this,*(Type **)(lVar9 + 0x28))
    ;
    if (PVar4.data._M_elems == (_Type)0x0) {
      return 0;
    }
    local_238._0_8_ = this->context_;
    local_60._0_4_ = 0x14ee;
    local_70._M_array = (iterator)((ulong)local_70._M_array._4_4_ << 0x20);
    local_338._24_8_ = local_338 + 0x10;
    local_338._0_8_ = &PTR__SmallVector_003e9b28;
    local_318._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_338._16_4_ = PVar4.data._M_elems;
    local_338._8_8_ = 1;
    local_208._0_4_ = 1;
    auStack_200._0_8_ = &PTR__SmallVector_003e9b28;
    auStack_200._8_8_ = (spv_operand_table)0x0;
    local_1f0._8_8_ = local_1f0;
    local_1e0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_200,
               (SmallVector<unsigned_int,_2UL> *)local_338);
    local_308._24_8_ = local_308 + 0x10;
    local_308._0_8_ = &PTR__SmallVector_003e9b28;
    local_2e8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_308._16_4_ = *&((array<signed_char,_4UL> *)(lVar9 + 0x30))->_M_elems;
    local_308._8_8_ = (pointer)0x1;
    local_1d8 = SPV_OPERAND_TYPE_SCOPE_ID;
    local_1d0._0_8_ = &PTR__SmallVector_003e9b28;
    local_1d0._8_8_ = 0;
    local_1d0._24_8_ = local_1d0 + 0x10;
    local_1b0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_1d0,
               (SmallVector<unsigned_int,_2UL> *)local_308);
    local_2b0._16_4_ = *(_Type *)(lVar9 + 0x34);
    local_2b0._24_8_ = local_2b0 + 0x10;
    local_2b0._0_8_ = &PTR__SmallVector_003e9b28;
    local_290._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2b0._8_8_ = 1;
    local_1a8 = SPV_OPERAND_TYPE_ID;
    local_1a0._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
    local_1a0.size_ = 0;
    local_1a0.small_data_ = (uint *)local_1a0.buffer;
    local_1a0.large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&local_1a0,(SmallVector<unsigned_int,_2UL> *)local_2b0);
    local_2d8._16_4_ = *(_Type *)(lVar9 + 0x38);
    local_2d8._24_8_ = local_2d8 + 0x10;
    local_2d8._0_8_ = &PTR__SmallVector_003e9b28;
    local_2b8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2d8._8_8_ = 1;
    local_178 = 1.4013e-45;
    local_170._0_8_ = &PTR__SmallVector_003e9b28;
    local_170._8_8_ = (__node_base_ptr)0x0;
    local_170._24_8_ = local_170 + 0x10;
    pdVar10 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
              &local_150;
    local_150._M_nxt = (_Hash_node_base *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_170,
               (SmallVector<unsigned_int,_2UL> *)local_2d8);
    local_288._0_8_ = local_208;
    local_288._8_8_ = 4;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)local_260,(IRContext **)local_238,(Op *)local_60,(int *)&local_70,
               &local_33c,(initializer_list<spvtools::opt::Operand> *)local_288);
    pIVar7 = (IRContext *)local_260._0_8_;
    local_260._0_8_ = (IRContext *)0x0;
    lVar9 = -0xc0;
    do {
      *(undefined ***)(pdVar10 + -0x20) = &PTR__SmallVector_003e9b28;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar10,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10);
      }
      *(undefined8 *)pdVar10 = 0;
      pdVar10 = pdVar10 + -0x30;
      lVar9 = lVar9 + 0x30;
    } while (lVar9 != 0);
LAB_001a8bee:
    local_2d8._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_2b8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_2b8,local_2b8._M_head_impl);
    }
    local_2b0._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_290._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_290,local_290._M_head_impl);
    }
LAB_001a8c2f:
    local_308._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_2e8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_2e8,local_2e8._M_head_impl);
    }
    goto LAB_001a8e47;
  case kCooperativeMatrixKHR:
    iVar3 = (*pTVar2->_vptr_Type[0x38])(pTVar2);
    lVar9 = CONCAT44(extraout_var_06,iVar3);
    PVar4.data._M_elems = (array<signed_char,_4UL>)GetTypeInstruction(this,*(Type **)(lVar9 + 0x28))
    ;
    if (PVar4.data._M_elems == (_Type)0x0) {
      return 0;
    }
    local_60._0_8_ = this->context_;
    local_70._M_array = (iterator)CONCAT44(local_70._M_array._4_4_,0x1168);
    local_78 = (IRContext *)((ulong)local_78._4_4_ << 0x20);
    local_338._24_8_ = local_338 + 0x10;
    local_338._0_8_ = &PTR__SmallVector_003e9b28;
    local_318._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_338._16_4_ = PVar4.data._M_elems;
    local_338._8_8_ = 1;
    local_208._0_4_ = 1;
    auStack_200._0_8_ = &PTR__SmallVector_003e9b28;
    auStack_200._8_8_ = (spv_operand_table)0x0;
    local_1f0._8_8_ = local_1f0;
    local_1e0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)auStack_200,
               (SmallVector<unsigned_int,_2UL> *)local_338);
    local_308._24_8_ = local_308 + 0x10;
    local_308._0_8_ = &PTR__SmallVector_003e9b28;
    local_2e8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_308._16_4_ = *&((array<signed_char,_4UL> *)(lVar9 + 0x30))->_M_elems;
    local_308._8_8_ = (pointer)0x1;
    local_1d8 = SPV_OPERAND_TYPE_SCOPE_ID;
    local_1d0._0_8_ = &PTR__SmallVector_003e9b28;
    local_1d0._8_8_ = 0;
    local_1d0._24_8_ = local_1d0 + 0x10;
    local_1b0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_1d0,
               (SmallVector<unsigned_int,_2UL> *)local_308);
    local_2b0._16_4_ = *(_Type *)(lVar9 + 0x34);
    local_2b0._24_8_ = local_2b0 + 0x10;
    local_2b0._0_8_ = &PTR__SmallVector_003e9b28;
    local_290._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2b0._8_8_ = 1;
    local_1a8 = SPV_OPERAND_TYPE_ID;
    local_1a0._vptr_SmallVector = (_func_int **)&PTR__SmallVector_003e9b28;
    local_1a0.size_ = 0;
    local_1a0.small_data_ = (uint *)local_1a0.buffer;
    local_1a0.large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&local_1a0,(SmallVector<unsigned_int,_2UL> *)local_2b0);
    local_2d8._16_4_ = *(_Type *)(lVar9 + 0x38);
    local_2d8._24_8_ = local_2d8 + 0x10;
    local_2d8._0_8_ = &PTR__SmallVector_003e9b28;
    local_2b8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_2d8._8_8_ = 1;
    local_178 = 1.4013e-45;
    local_170._0_8_ = &PTR__SmallVector_003e9b28;
    local_170._8_8_ = (__node_base_ptr)0x0;
    local_170._24_8_ = local_170 + 0x10;
    local_150._M_nxt = (_Hash_node_base *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_170,
               (SmallVector<unsigned_int,_2UL> *)local_2d8);
    local_288._16_4_ = *(_Type *)(lVar9 + 0x3c);
    local_288._24_8_ = local_288 + 0x10;
    local_288._0_8_ = &PTR__SmallVector_003e9b28;
    local_268._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_288._8_8_ = 1;
    local_148 = SPV_OPERAND_TYPE_ID;
    local_140._0_8_ = &PTR__SmallVector_003e9b28;
    local_140._8_8_ = 0;
    local_140._24_8_ = local_140 + 0x10;
    pdVar10 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
              &local_120;
    local_120._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_140,
               (SmallVector<unsigned_int,_2UL> *)local_288);
    local_260._0_8_ = local_208;
    local_260._8_8_ = 5;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)local_238,(IRContext **)local_60,(Op *)&local_70,(int *)&local_78,
               &local_33c,(initializer_list<spvtools::opt::Operand> *)local_260);
    pIVar7 = (IRContext *)local_238._0_8_;
    local_238._0_8_ = (IRContext *)0x0;
    lVar9 = -0xf0;
    do {
      *(undefined ***)(pdVar10 + -0x20) = &PTR__SmallVector_003e9b28;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (pdVar10,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)pdVar10);
      }
      *(undefined8 *)pdVar10 = 0;
      pdVar10 = pdVar10 + -0x30;
      lVar9 = lVar9 + 0x30;
    } while (lVar9 != 0);
    local_288._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_268._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_268,local_268._M_head_impl);
    }
    local_2d8._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_2b8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_2b8,local_2b8._M_head_impl);
    }
    local_2b0._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_290._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_290,local_290._M_head_impl);
    }
LAB_001a8794:
    local_308._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_2e8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_2e8,local_2e8._M_head_impl);
    }
    goto LAB_001a8e47;
  case kRayQueryKHR:
    local_308._0_8_ = this->context_;
    local_2b0._0_4_ = 0x1178;
    break;
  case kHitObjectNV:
    local_308._0_8_ = this->context_;
    local_2b0._0_4_ = 0x14a1;
    break;
  default:
    __assert_fail("false && \"Unexpected type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/type_manager.cpp"
                  ,0x1bd,
                  "uint32_t spvtools::opt::analysis::TypeManager::GetTypeInstruction(const Type *)")
    ;
  }
  local_2d8._0_8_ = local_2d8._0_8_ & 0xffffffff00000000;
  local_208 = (undefined1  [8])0x0;
  auStack_200._0_8_ = (spv_operand_table)0x0;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)local_338,(IRContext **)local_308,(Op *)local_2b0,(int *)local_2d8,
             &local_33c,(initializer_list<spvtools::opt::Operand> *)local_208);
  pIVar7 = (IRContext *)local_338._0_8_;
LAB_001a8ec2:
  pIVar11 = this->context_;
  utils::IntrusiveList<spvtools::opt::Instruction>::push_back
            (&(((pIVar11->module_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->types_values_)
              .super_IntrusiveList<spvtools::opt::Instruction>,(Instruction *)pIVar7);
  if ((pIVar11->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
    DefUseManager::AnalyzeInstDefUse
              ((pIVar11->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               (((pIVar11->module_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                 .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->types_values_
               ).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
               super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
  }
  pTVar2 = local_80;
  pIVar7 = this->context_;
  if ((pIVar7->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
    DefUseManager::AnalyzeInstDefUse
              ((pIVar7->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               (((pIVar7->module_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                 .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->types_values_
               ).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
               super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
  }
  AttachDecorations(this,local_33c,pTVar2);
  return local_33c;
}

Assistant:

uint32_t TypeManager::GetTypeInstruction(const Type* type) {
  uint32_t id = GetId(type);
  if (id != 0) return id;

  std::unique_ptr<Instruction> typeInst;
  // TODO(1841): Handle id overflow.
  id = context()->TakeNextId();
  if (id == 0) {
    return 0;
  }

  RegisterType(id, *type);
  switch (type->kind()) {
#define DefineParameterlessCase(kind)                                         \
  case Type::k##kind:                                                         \
    typeInst = MakeUnique<Instruction>(context(), spv::Op::OpType##kind, 0,   \
                                       id, std::initializer_list<Operand>{}); \
    break
    DefineParameterlessCase(Void);
    DefineParameterlessCase(Bool);
    DefineParameterlessCase(Sampler);
    DefineParameterlessCase(Event);
    DefineParameterlessCase(DeviceEvent);
    DefineParameterlessCase(ReserveId);
    DefineParameterlessCase(Queue);
    DefineParameterlessCase(PipeStorage);
    DefineParameterlessCase(NamedBarrier);
    DefineParameterlessCase(AccelerationStructureNV);
    DefineParameterlessCase(RayQueryKHR);
    DefineParameterlessCase(HitObjectNV);
#undef DefineParameterlessCase
    case Type::kInteger:
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeInt, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_LITERAL_INTEGER, {type->AsInteger()->width()}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER,
               {(type->AsInteger()->IsSigned() ? 1u : 0u)}}});
      break;
    case Type::kFloat:
      // TODO: Handle FP encoding enums once actually used.
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeFloat, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_LITERAL_INTEGER, {type->AsFloat()->width()}}});
      break;
    case Type::kVector: {
      uint32_t subtype = GetTypeInstruction(type->AsVector()->element_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst =
          MakeUnique<Instruction>(context(), spv::Op::OpTypeVector, 0, id,
                                  std::initializer_list<Operand>{
                                      {SPV_OPERAND_TYPE_ID, {subtype}},
                                      {SPV_OPERAND_TYPE_LITERAL_INTEGER,
                                       {type->AsVector()->element_count()}}});
      break;
    }
    case Type::kMatrix: {
      uint32_t subtype = GetTypeInstruction(type->AsMatrix()->element_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst =
          MakeUnique<Instruction>(context(), spv::Op::OpTypeMatrix, 0, id,
                                  std::initializer_list<Operand>{
                                      {SPV_OPERAND_TYPE_ID, {subtype}},
                                      {SPV_OPERAND_TYPE_LITERAL_INTEGER,
                                       {type->AsMatrix()->element_count()}}});
      break;
    }
    case Type::kImage: {
      const Image* image = type->AsImage();
      uint32_t subtype = GetTypeInstruction(image->sampled_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeImage, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {subtype}},
              {SPV_OPERAND_TYPE_DIMENSIONALITY,
               {static_cast<uint32_t>(image->dim())}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER, {image->depth()}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER,
               {(image->is_arrayed() ? 1u : 0u)}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER,
               {(image->is_multisampled() ? 1u : 0u)}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER, {image->sampled()}},
              {SPV_OPERAND_TYPE_SAMPLER_IMAGE_FORMAT,
               {static_cast<uint32_t>(image->format())}},
              {SPV_OPERAND_TYPE_ACCESS_QUALIFIER,
               {static_cast<uint32_t>(image->access_qualifier())}}});
      break;
    }
    case Type::kSampledImage: {
      uint32_t subtype =
          GetTypeInstruction(type->AsSampledImage()->image_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeSampledImage, 0, id,
          std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {subtype}}});
      break;
    }
    case Type::kArray: {
      uint32_t subtype = GetTypeInstruction(type->AsArray()->element_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeArray, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {subtype}},
              {SPV_OPERAND_TYPE_ID, {type->AsArray()->LengthId()}}});
      break;
    }
    case Type::kRuntimeArray: {
      uint32_t subtype =
          GetTypeInstruction(type->AsRuntimeArray()->element_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeRuntimeArray, 0, id,
          std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {subtype}}});
      break;
    }
    case Type::kStruct: {
      std::vector<Operand> ops;
      const Struct* structTy = type->AsStruct();
      for (auto ty : structTy->element_types()) {
        uint32_t member_type_id = GetTypeInstruction(ty);
        if (member_type_id == 0) {
          return 0;
        }
        ops.push_back(Operand(SPV_OPERAND_TYPE_ID, {member_type_id}));
      }
      typeInst =
          MakeUnique<Instruction>(context(), spv::Op::OpTypeStruct, 0, id, ops);
      break;
    }
    case Type::kOpaque: {
      const Opaque* opaque = type->AsOpaque();
      // Convert to null-terminated packed UTF-8 string.
      std::vector<uint32_t> words = spvtools::utils::MakeVector(opaque->name());
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeOpaque, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_LITERAL_STRING, words}});
      break;
    }
    case Type::kPointer: {
      const Pointer* pointer = type->AsPointer();
      uint32_t subtype = GetTypeInstruction(pointer->pointee_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypePointer, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_STORAGE_CLASS,
               {static_cast<uint32_t>(pointer->storage_class())}},
              {SPV_OPERAND_TYPE_ID, {subtype}}});
      break;
    }
    case Type::kFunction: {
      std::vector<Operand> ops;
      const Function* function = type->AsFunction();
      uint32_t return_type_id = GetTypeInstruction(function->return_type());
      if (return_type_id == 0) {
        return 0;
      }
      ops.push_back(Operand(SPV_OPERAND_TYPE_ID, {return_type_id}));
      for (auto ty : function->param_types()) {
        uint32_t paramater_type_id = GetTypeInstruction(ty);
        if (paramater_type_id == 0) {
          return 0;
        }
        ops.push_back(Operand(SPV_OPERAND_TYPE_ID, {paramater_type_id}));
      }
      typeInst = MakeUnique<Instruction>(context(), spv::Op::OpTypeFunction, 0,
                                         id, ops);
      break;
    }
    case Type::kPipe:
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypePipe, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ACCESS_QUALIFIER,
               {static_cast<uint32_t>(type->AsPipe()->access_qualifier())}}});
      break;
    case Type::kForwardPointer:
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeForwardPointer, 0, 0,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {type->AsForwardPointer()->target_id()}},
              {SPV_OPERAND_TYPE_STORAGE_CLASS,
               {static_cast<uint32_t>(
                   type->AsForwardPointer()->storage_class())}}});
      break;
    case Type::kCooperativeMatrixNV: {
      auto coop_mat = type->AsCooperativeMatrixNV();
      uint32_t const component_type =
          GetTypeInstruction(coop_mat->component_type());
      if (component_type == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeCooperativeMatrixNV, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {component_type}},
              {SPV_OPERAND_TYPE_SCOPE_ID, {coop_mat->scope_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->rows_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->columns_id()}}});
      break;
    }
    case Type::kCooperativeMatrixKHR: {
      auto coop_mat = type->AsCooperativeMatrixKHR();
      uint32_t const component_type =
          GetTypeInstruction(coop_mat->component_type());
      if (component_type == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeCooperativeMatrixKHR, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {component_type}},
              {SPV_OPERAND_TYPE_SCOPE_ID, {coop_mat->scope_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->rows_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->columns_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->use_id()}}});
      break;
    }
    default:
      assert(false && "Unexpected type");
      break;
  }
  context()->AddType(std::move(typeInst));
  context()->AnalyzeDefUse(&*--context()->types_values_end());
  AttachDecorations(id, type);
  return id;
}